

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

RefPtr<wabt::interp::Global> * __thiscall
wabt::interp::Store::
Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
          (RefPtr<wabt::interp::Global> *__return_storage_ptr__,Store *this,Store *args,
          GlobalType *args_1,Value *args_2)

{
  ExternKind EVar1;
  u64 uVar2;
  undefined8 uVar3;
  Ref ref;
  Global *local_30;
  
  local_30 = (Global *)operator_new(0x68);
  EVar1 = (args_1->super_ExternType).kind;
  (local_30->super_Extern).super_Object.kind_ = Global;
  (local_30->super_Extern).super_Object.host_info_ = (void *)0x0;
  (local_30->super_Extern).super_Object.self_.index = 0;
  (local_30->super_Extern).super_Object.finalizer_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (local_30->super_Extern).super_Object.finalizer_._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(local_30->super_Extern).super_Object.finalizer_.super__Function_base._M_functor =
       0;
  *(undefined8 *)
   ((long)&(local_30->super_Extern).super_Object.finalizer_.super__Function_base._M_functor + 8) = 0
  ;
  (local_30->super_Extern).super_Object._vptr_Object = (_func_int **)&PTR__Global_0024e790;
  (local_30->type_).super_ExternType.kind = EVar1;
  (local_30->type_).super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_0024e940;
  uVar2 = (args_2->field_0).i64_;
  uVar3 = *(undefined8 *)((long)&args_2->field_0 + 8);
  *(undefined8 *)&(local_30->type_).super_ExternType.field_0xc =
       *(undefined8 *)&(args_1->super_ExternType).field_0xc;
  (local_30->type_).mut = args_1->mut;
  (local_30->value_).field_0.i64_ = uVar2;
  *(undefined8 *)((long)&(local_30->value_).field_0 + 8) = uVar3;
  ref.index = FreeList<wabt::interp::Object*>::New<wabt::interp::Global*>
                        ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_30);
  RefPtr<wabt::interp::Global>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Extern).super_Object.self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}